

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

Cookie * Curl_cookie_getlist(Curl_easy *data,CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  curl_trc_feat *pcVar2;
  undefined8 *puVar3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  byte bVar7;
  _Bool _Var8;
  int iVar9;
  size_t sVar10;
  size_t sVar11;
  Cookie *pCVar12;
  char *pcVar13;
  char *__s;
  char *pcVar14;
  size_t sVar15;
  undefined8 *__base;
  Cookie *pCVar16;
  size_t __nmemb;
  Cookie *pCVar17;
  
  sVar10 = cookiehash(host);
  if ((c != (CookieInfo *)0x0) && (c->cookies[sVar10] != (Cookie *)0x0)) {
    remove_expired(c);
    _Var6 = Curl_host_is_ipnum(host);
    pCVar17 = c->cookies[sVar10];
    if (pCVar17 != (Cookie *)0x0) {
      pCVar16 = (Cookie *)0x0;
      __nmemb = 0;
      do {
        if ((byte)(pCVar17->secure ^ 1U | secure) != 1) goto LAB_0011ed3a;
        pcVar13 = pCVar17->domain;
        if (pcVar13 != (char *)0x0) {
          bVar7 = pCVar17->tailmatch ^ 1;
          if ((bVar7 & 1) == 0 && !_Var6) {
            sVar11 = strlen(pcVar13);
            _Var8 = cookie_tailmatch(pcVar13,sVar11,host);
            if (_Var8) goto LAB_0011ebb9;
            bVar7 = pCVar17->tailmatch ^ 1;
          }
          if (((bVar7 & 1) == 0 && !_Var6) ||
             (iVar9 = curl_strequal(host,pCVar17->domain), iVar9 == 0)) goto LAB_0011ed3a;
        }
LAB_0011ebb9:
        pcVar13 = pCVar17->spath;
        if ((pcVar13 == (char *)0x0) || (sVar11 = strlen(pcVar13), sVar11 == 1)) goto LAB_0011ebd4;
        __s = (*Curl_cstrdup)(path);
        if (__s != (char *)0x0) {
          pcVar14 = strchr(__s,0x3f);
          if (pcVar14 != (char *)0x0) {
            *pcVar14 = '\0';
          }
          if (*__s != '/') {
            (*Curl_cfree)(__s);
            __s = (char *)Curl_memdup0("/",1);
            if (__s == (char *)0x0) goto LAB_0011ed3a;
          }
          sVar15 = strlen(__s);
          if ((sVar15 < sVar11) || (iVar9 = strncmp(pcVar13,__s,sVar11), iVar9 != 0)) {
            (*Curl_cfree)(__s);
          }
          else {
            if (sVar11 == sVar15) {
              (*Curl_cfree)(__s);
            }
            else {
              cVar1 = __s[sVar11];
              (*Curl_cfree)(__s);
              if (cVar1 != '/') goto LAB_0011ed3a;
            }
LAB_0011ebd4:
            pCVar12 = (Cookie *)(*Curl_ccalloc)(1,0x48);
            if (pCVar12 == (Cookie *)0x0) goto joined_r0x0011ee26;
            if (pCVar17->domain != (char *)0x0) {
              pcVar13 = (*Curl_cstrdup)(pCVar17->domain);
              pCVar12->domain = pcVar13;
              if (pcVar13 != (char *)0x0) goto LAB_0011ec13;
LAB_0011ee16:
              freecookie(pCVar12);
              goto joined_r0x0011ee26;
            }
LAB_0011ec13:
            if (pCVar17->path != (char *)0x0) {
              pcVar13 = (*Curl_cstrdup)(pCVar17->path);
              pCVar12->path = pcVar13;
              if (pcVar13 == (char *)0x0) goto LAB_0011ee16;
            }
            if (pCVar17->spath != (char *)0x0) {
              pcVar13 = (*Curl_cstrdup)(pCVar17->spath);
              pCVar12->spath = pcVar13;
              if (pcVar13 == (char *)0x0) goto LAB_0011ee16;
            }
            if (pCVar17->name != (char *)0x0) {
              pcVar13 = (*Curl_cstrdup)(pCVar17->name);
              pCVar12->name = pcVar13;
              if (pcVar13 == (char *)0x0) goto LAB_0011ee16;
            }
            if (pCVar17->value != (char *)0x0) {
              pcVar13 = (*Curl_cstrdup)(pCVar17->value);
              pCVar12->value = pcVar13;
              if (pcVar13 == (char *)0x0) goto LAB_0011ee16;
            }
            pCVar12->expires = pCVar17->expires;
            _Var8 = pCVar17->secure;
            _Var4 = pCVar17->livecookie;
            _Var5 = pCVar17->httponly;
            pCVar12->tailmatch = pCVar17->tailmatch;
            pCVar12->secure = _Var8;
            pCVar12->livecookie = _Var4;
            pCVar12->httponly = _Var5;
            pCVar12->creationtime = pCVar17->creationtime;
            pCVar12->next = pCVar16;
            __nmemb = __nmemb + 1;
            pCVar16 = pCVar12;
            if (0x95 < __nmemb) {
              if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                 ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar2->log_level)))) {
                Curl_infof(data,"Included max number of cookies (%zu) in request!",__nmemb);
              }
              goto LAB_0011ed92;
            }
          }
        }
LAB_0011ed3a:
        pCVar17 = pCVar17->next;
      } while (pCVar17 != (Cookie *)0x0);
      pCVar12 = pCVar16;
      if (__nmemb == 0) {
        return pCVar16;
      }
LAB_0011ed92:
      __base = (undefined8 *)(*Curl_cmalloc)(__nmemb * 8);
      pCVar16 = pCVar12;
      puVar3 = __base;
      if (__base != (undefined8 *)0x0) {
        for (; pCVar12 != (Cookie *)0x0; pCVar12 = pCVar12->next) {
          *puVar3 = pCVar12;
          puVar3 = puVar3 + 1;
        }
        qsort(__base,__nmemb,8,cookie_sort);
        pCVar17 = (Cookie *)*__base;
        if (__nmemb != 1) {
          sVar11 = 1;
          pCVar16 = pCVar17;
          do {
            pCVar12 = (Cookie *)__base[sVar11];
            pCVar16->next = pCVar12;
            sVar11 = sVar11 + 1;
            pCVar16 = pCVar12;
          } while (__nmemb != sVar11);
        }
        *(undefined8 *)__base[__nmemb - 1] = 0;
        (*Curl_cfree)(__base);
        return pCVar17;
      }
joined_r0x0011ee26:
      while (pCVar16 != (Cookie *)0x0) {
        pCVar17 = pCVar16->next;
        freecookie(pCVar16);
        pCVar16 = pCVar17;
      }
    }
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct Curl_easy *data,
                                   struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  struct Cookie *mainco = NULL;
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);

  if(!c || !c->cookies[myhash])
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = Curl_host_is_ipnum(host);

  co = c->cookies[myhash];

  while(co) {
    /* if the cookie requires we are secure we must only continue if we are! */
    if(co->secure?secure:TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip &&
          cookie_tailmatch(co->domain, strlen(co->domain), host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /*
         * the right part of the host matches the domain stuff in the
         * cookie data
         */

        /*
         * now check the left part of the path with the cookies path
         * requirement
         */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /*
           * and now, we know this is a match and we should create an
           * entry for the return-linked-list
           */

          newco = dup_cookie(co);
          if(newco) {
            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
            if(matches >= MAX_COOKIE_SEND_AMOUNT) {
              infof(data, "Included max number of cookies (%zu) in request!",
                    matches);
              break;
            }
          }
          else
            goto fail;
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /*
     * Now we need to make sure that if there is a name appearing more than
     * once, the longest specified path version comes first. To make this
     * the swiftest way, we just sort them all based on path length.
     */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i = 0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i = 0; i<matches-1; i++)
      array[i]->next = array[i + 1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_cookie_freelist(mainco);
  return NULL;
}